

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_fuseahuref(ASMState *as,IRRef ref,RegSet allow)

{
  IRIns *ir;
  IRIns *pIVar1;
  byte bVar2;
  long lVar4;
  Reg RVar3;
  
  pIVar1 = as->ir;
  bVar2 = *(byte *)((long)pIVar1 + (ulong)ref * 8 + 6);
  if ((char)bVar2 < '\0') {
    ir = pIVar1 + ref;
    switch((ir->field_1).o) {
    case '8':
      if (as->fuseref < ref) {
        asm_fusearef(as,ir,allow);
        return;
      }
      break;
    case '9':
      if (as->fuseref < ref) {
        bVar2 = *(byte *)((long)pIVar1 + (ulong)(ir->field_0).op1 * 8 + 6);
        if ((char)bVar2 < '\0') {
          RVar3 = ra_allocref(as,(uint)(ir->field_0).op1,allow);
          bVar2 = (byte)RVar3;
        }
        as->weakset = as->weakset & (-2 << (bVar2 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar2 & 0x1f));
        (as->mrm).base = bVar2;
        (as->mrm).ofs = (uint)*(ushort *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 2) * 0x18;
        goto LAB_0013f9d7;
      }
      break;
    case '=':
      if ((-1 < (long)(short)(ir->field_0).op1) &&
         (lVar4 = *(long *)((long)pIVar1[(long)(short)(ir->field_0).op1 + 1] + 0x28 +
                           (ulong)*(byte *)((long)&(ir->field_0).op2 + 1) * 8) - (long)as->J,
         (lVar4 + 0x7ffff368U | lVar4 + 0x7ffff36cU) >> 0x20 == 0)) {
        (as->mrm).ofs = (int)lVar4 + -0xc98;
        goto LAB_0013facb;
      }
      break;
    case '?':
      (as->mrm).ofs = -0xe98;
LAB_0013facb:
      (as->mrm).base = '\x0e';
      (as->mrm).idx = 0x80;
      return;
    }
  }
  if ((char)bVar2 < '\0') {
    RVar3 = ra_allocref(as,ref,allow);
    bVar2 = (byte)RVar3;
  }
  as->weakset = as->weakset & (-2 << (bVar2 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar2 & 0x1f));
  (as->mrm).base = bVar2;
  (as->mrm).ofs = 0;
LAB_0013f9d7:
  (as->mrm).idx = 0x80;
  return;
}

Assistant:

static void asm_fuseahuref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  if (ra_noreg(ir->r)) {
    switch ((IROp)ir->o) {
    case IR_AREF:
      if (mayfuse(as, ref)) {
	asm_fusearef(as, ir, allow);
	return;
      }
      break;
    case IR_HREFK:
      if (mayfuse(as, ref)) {
	as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
	as->mrm.ofs = (int32_t)(IR(ir->op2)->op2 * sizeof(Node));
	as->mrm.idx = RID_NONE;
	return;
      }
      break;
    case IR_UREFC:
      if (irref_isk(ir->op1)) {
	GCfunc *fn = ir_kfunc(IR(ir->op1));
	GCupval *uv = &gcref(fn->l.uvptr[(ir->op2 >> 8)])->uv;
#if LJ_GC64
	int64_t ofs = dispofs(as, &uv->tv);
	if (checki32(ofs) && checki32(ofs+4)) {
	  as->mrm.ofs = (int32_t)ofs;
	  as->mrm.base = RID_DISPATCH;
	  as->mrm.idx = RID_NONE;
	  return;
	}
#else
	as->mrm.ofs = ptr2addr(&uv->tv);
	as->mrm.base = as->mrm.idx = RID_NONE;
	return;
#endif
      }
      break;
    case IR_TMPREF:
#if LJ_GC64
      as->mrm.ofs = (int32_t)dispofs(as, &J2G(as->J)->tmptv);
      as->mrm.base = RID_DISPATCH;
      as->mrm.idx = RID_NONE;
#else
      as->mrm.ofs = igcptr(&J2G(as->J)->tmptv);
      as->mrm.base = as->mrm.idx = RID_NONE;
#endif
      return;
    default:
      break;
    }
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ref, allow);
  as->mrm.ofs = 0;
  as->mrm.idx = RID_NONE;
}